

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O0

undefined8 __thiscall
cfd::api::HDWalletApi::GetPubkeyFromExtkey(HDWalletApi *this,string *extkey,NetType net_type)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  NetType in_ECX;
  string *in_RDX;
  undefined8 in_RDI;
  uint32_t check_version;
  uint32_t version;
  string errmsg_1;
  CfdException *pub_except;
  string errmsg;
  CfdException *except;
  ExtPubkey ext_pubkey;
  ExtPrivkey ext_privkey;
  string result;
  ExtPrivkey *in_stack_fffffffffffffbf8;
  ExtPrivkey *in_stack_fffffffffffffc00;
  CfdError in_stack_fffffffffffffc1c;
  CfdException *in_stack_fffffffffffffc20;
  allocator local_371;
  string local_370 [32];
  char *local_350;
  undefined4 local_348;
  char *local_340;
  uint32_t local_334;
  uint32_t local_330;
  ExtPubkey local_2c0 [2];
  ExtPrivkey local_1b0;
  ExtPubkey local_138;
  ExtPrivkey local_b8;
  string local_40 [36];
  NetType local_1c;
  string *local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_40);
  cfd::core::ExtPrivkey::ExtPrivkey(&local_b8);
  cfd::core::ExtPubkey::ExtPubkey(&local_138);
  cfd::core::ExtPrivkey::ExtPrivkey(&local_1b0,local_18);
  core::ExtPrivkey::operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffffc00);
  bVar1 = cfd::core::ExtPrivkey::IsValid();
  if ((bVar1 & 1) == 0) {
    cfd::core::ExtPubkey::ExtPubkey(local_2c0,local_18);
    core::ExtPubkey::operator=
              ((ExtPubkey *)in_stack_fffffffffffffc00,(ExtPubkey *)in_stack_fffffffffffffbf8);
    core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffc00);
  }
  else {
    cfd::core::ExtPrivkey::GetExtPubkey();
    core::ExtPubkey::operator=
              ((ExtPubkey *)in_stack_fffffffffffffc00,(ExtPubkey *)in_stack_fffffffffffffbf8);
    core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffc00);
  }
  uVar2 = cfd::core::ExtPubkey::GetVersion();
  local_330 = uVar2;
  uVar3 = GetExtkeyVersion(kExtPubkey,local_1c);
  local_334 = uVar3;
  if (local_330 != uVar3) {
    local_350 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_hdwallet.cpp"
                        ,0x2f);
    local_350 = local_350 + 1;
    local_348 = 0x166;
    local_340 = "GetPubkeyFromExtkey";
    core::logger::warn<unsigned_int&>
              ((CfdSourceLocation *)in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
               (uint *)0x3fed16);
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_370,"extkey networkType unmatch.",&local_371);
    core::CfdException::CfdException
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c,(string *)CONCAT44(uVar2,uVar3));
    __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::ExtPubkey::GetPubkey();
  cfd::core::Pubkey::GetHex_abi_cxx11_();
  core::Pubkey::~Pubkey((Pubkey *)0x3fee28);
  core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffc00);
  core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffffc00);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string HDWalletApi::GetPubkeyFromExtkey(
    const std::string& extkey, NetType net_type) const {
  std::string result;
  ExtPrivkey ext_privkey;
  ExtPubkey ext_pubkey;

  try {
    ext_privkey = ExtPrivkey(extkey);
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if ((errmsg.find(kBase58Error) == std::string::npos) &&
        (errmsg.find(kKeyTypeError) == std::string::npos)) {
      throw except;
    }
  }

  if (ext_privkey.IsValid()) {
    ext_pubkey = ext_privkey.GetExtPubkey();
  } else {
    try {
      ext_pubkey = ExtPubkey(extkey);
    } catch (const CfdException& pub_except) {
      std::string errmsg(pub_except.what());
      if (errmsg.find(kBase58Error) != std::string::npos) {
        warn(CFD_LOG_SOURCE, "Illegal extkey. base58 decode error.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Illegal extkey. base58 decode error.");
      }
      throw pub_except;
    }
  }

  uint32_t version = ext_pubkey.GetVersion();
  uint32_t check_version = GetExtkeyVersion(ExtKeyType::kExtPubkey, net_type);
  if (version != check_version) {
    warn(CFD_LOG_SOURCE, "Version unmatch. key version: {}", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }
  return ext_pubkey.GetPubkey().GetHex();
}